

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

PositionMode __thiscall QCss::Declaration::positionValue(Declaration *this)

{
  bool bVar1;
  DeclarationData *pDVar2;
  qsizetype qVar3;
  quint64 qVar4;
  QCssKnownValue *in_RDI;
  long in_FS_OFFSET;
  int v;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QCssKnownValue *start;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  PositionMode PVar5;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  start = in_RDI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e63a);
  bVar1 = ::QVariant::isValid((QVariant *)in_RDI);
  if (bVar1) {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e656
                       );
    PVar5 = ::QVariant::toInt((bool *)&pDVar2->parsed);
  }
  else {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e679
                       );
    qVar3 = QList<QCss::Value>::size(&pDVar2->values);
    if (qVar3 == 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e6a2);
      QList<QCss::Value>::at
                ((QList<QCss::Value> *)in_RDI,
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      ::QVariant::toString();
      qVar4 = findKnownValue((QString *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),start,
                             in_stack_ffffffffffffffac);
      PVar5 = (PositionMode)qVar4;
      QString::~QString((QString *)0xa2e6e7);
      ::QVariant::QVariant(&local_28,PVar5);
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e707);
      ::QVariant::operator=
                ((QVariant *)CONCAT44(PVar5,in_stack_ffffffffffffffa8),(QVariant *)in_RDI);
      ::QVariant::~QVariant(&local_28);
    }
    else {
      PVar5 = PositionMode_Unknown;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return PVar5;
  }
  __stack_chk_fail();
}

Assistant:

PositionMode Declaration::positionValue() const
{
    if (d->parsed.isValid())
        return static_cast<PositionMode>(d->parsed.toInt());
    if (d->values.size() != 1)
        return PositionMode_Unknown;
    int v = findKnownValue(d->values.at(0).variant.toString(),
                           positions, NumKnownPositionModes);
    d->parsed = v;
    return static_cast<PositionMode>(v);
}